

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateSequence(ExpressionTranslateContext *ctx,ExprSequence *expression)

{
  bool bVar1;
  uint uVar2;
  ExprBase **ppEVar3;
  uint local_1c;
  uint i;
  ExprSequence *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  bVar1 = SmallArray<ExprBase_*,_4U>::empty(&expression->expressions);
  if (bVar1) {
    Print(ctx,"/*empty sequence*/");
  }
  else {
    Print(ctx,"(");
    PrintLine(ctx);
    ctx->depth = ctx->depth + 1;
    local_1c = 0;
    while( true ) {
      uVar2 = SmallArray<ExprBase_*,_4U>::size(&expression->expressions);
      if (uVar2 <= local_1c) break;
      PrintIndent(ctx);
      ppEVar3 = SmallArray<ExprBase_*,_4U>::operator[](&expression->expressions,local_1c);
      Translate(ctx,*ppEVar3);
      uVar2 = SmallArray<ExprBase_*,_4U>::size(&expression->expressions);
      if (local_1c + 1 < uVar2) {
        Print(ctx,", ");
      }
      PrintLine(ctx);
      local_1c = local_1c + 1;
    }
    ctx->depth = ctx->depth - 1;
    PrintIndent(ctx);
    Print(ctx,")");
  }
  return;
}

Assistant:

void TranslateSequence(ExpressionTranslateContext &ctx, ExprSequence *expression)
{
	if(expression->expressions.empty())
	{
		Print(ctx, "/*empty sequence*/");
		return;
	}

	Print(ctx, "(");
	PrintLine(ctx);

	ctx.depth++;

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		PrintIndent(ctx);

		Translate(ctx, expression->expressions[i]);

		if(i + 1 < expression->expressions.size())
			Print(ctx, ", ");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, ")");
}